

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O1

void __thiscall
LexerReadEvalStringEscapes::~LexerReadEvalStringEscapes(LexerReadEvalStringEscapes *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Lexer, ReadEvalStringEscapes) {
  Lexer lexer("$ $$ab c$: $\ncde\n");
  EvalString eval;
  string err;
  EXPECT_TRUE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("", err);
  EXPECT_EQ("[ $ab c: cde]",
            eval.Serialize());
}